

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O2

int getPixelInterpolated(gdImagePtr im,double x,double y,int bgColor)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  double *pdVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double local_110;
  double local_108;
  double local_f8;
  double local_e8;
  double kernel_y [4];
  double kernel_x [12];
  
  uVar1 = 0xffffffff;
  if (im->interpolation_id != GD_NEAREST_NEIGHBOUR) {
    iVar10 = (int)x;
    iVar9 = (int)y;
    if (im->interpolation_id == GD_WEIGHTED4) {
      if (im->trueColor == 1) {
        uVar1 = getPixelOverflowTC(im,iVar10,iVar9,bgColor);
      }
      else {
        uVar1 = getPixelOverflowPalette(im,iVar10,iVar9,bgColor);
      }
      iVar5 = iVar10 + -1;
      if (im->trueColor == 1) {
        uVar2 = getPixelOverflowTC(im,iVar5,iVar9,bgColor);
      }
      else {
        uVar2 = getPixelOverflowPalette(im,iVar5,iVar9,bgColor);
      }
      dVar12 = x - (double)iVar10;
      dVar13 = y - (double)iVar9;
      iVar9 = iVar9 + -1;
      if (im->trueColor == 1) {
        uVar3 = getPixelOverflowTC(im,iVar10,iVar9,bgColor);
      }
      else {
        uVar3 = getPixelOverflowPalette(im,iVar10,iVar9,bgColor);
      }
      if (im->trueColor == 1) {
        uVar4 = getPixelOverflowTC(im,iVar5,iVar9,bgColor);
      }
      else {
        uVar4 = getPixelOverflowPalette(im,iVar10,iVar9,bgColor);
      }
      dVar14 = dVar12 * dVar13;
      dVar16 = dVar13 * (1.0 - dVar12);
      dVar17 = dVar12 * (1.0 - dVar13);
      dVar12 = (1.0 - dVar12) * (1.0 - dVar13);
      if (im->trueColor == 0) {
        dVar18 = (double)im->blue[(int)uVar4] * dVar12 +
                 dVar17 * (double)im->blue[(int)uVar3] +
                 (double)im->blue[(int)uVar1] * dVar14 + dVar16 * (double)im->blue[(int)uVar2];
        dVar19 = (double)im->alpha[(int)uVar4] * dVar12 +
                 dVar17 * (double)im->alpha[(int)uVar3] +
                 (double)im->alpha[(int)uVar1] * dVar14 + dVar16 * (double)im->alpha[(int)uVar2];
        dVar13 = dVar12 * (double)im->red[(int)uVar4] +
                 (double)im->red[(int)uVar3] * dVar17 +
                 dVar14 * (double)im->red[(int)uVar1] + (double)im->red[(int)uVar2] * dVar16;
        dVar15 = dVar12 * (double)im->green[(int)uVar4] +
                 (double)im->green[(int)uVar3] * dVar17 +
                 dVar14 * (double)im->green[(int)uVar1] + (double)im->green[(int)uVar2] * dVar16;
      }
      else {
        dVar13 = (double)(uVar4 >> 0x10 & 0xff) * dVar12 +
                 dVar17 * (double)(uVar3 >> 0x10 & 0xff) +
                 (double)(uVar1 >> 0x10 & 0xff) * dVar14 + dVar16 * (double)(uVar2 >> 0x10 & 0xff);
        dVar15 = (double)(uVar4 >> 8 & 0xff) * dVar12 +
                 dVar17 * (double)(uVar3 >> 8 & 0xff) +
                 (double)(uVar1 >> 8 & 0xff) * dVar14 + dVar16 * (double)(uVar2 >> 8 & 0xff);
        dVar18 = dVar12 * (double)(uVar4 & 0xff) +
                 (double)(uVar3 & 0xff) * dVar17 +
                 dVar14 * (double)(uVar1 & 0xff) + (double)(uVar2 & 0xff) * dVar16;
        dVar19 = dVar12 * (double)(uVar4 >> 0x18 & 0x7f) +
                 (double)(uVar3 >> 0x18 & 0x7f) * dVar17 +
                 dVar14 * (double)(uVar1 >> 0x18 & 0x7f) + (double)(uVar2 >> 0x18 & 0x7f) * dVar16;
      }
      uVar1 = (uint)dVar18;
      iVar9 = (int)dVar15;
      iVar10 = (int)dVar13;
      if ((int)dVar13 < 1) {
        iVar10 = 0;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (0xfe < iVar9) {
        iVar9 = 0xff;
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      if (0xfe < (int)uVar1) {
        uVar1 = 0xff;
      }
      iVar5 = 0;
      if (0 < (int)dVar19) {
        iVar5 = (int)dVar19;
      }
      iVar7 = 0x7f;
      if (iVar5 < 0x7f) {
        iVar7 = iVar5;
      }
      uVar1 = iVar9 << 8 | uVar1 | iVar10 << 0x10 | iVar7 << 0x18;
    }
    else if (im->interpolation != (interpolation_method)0x0) {
      iVar5 = iVar10 + -1;
      iVar7 = iVar9 + -1;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        dVar12 = (*im->interpolation)((double)(iVar5 + (int)lVar8) - x);
        kernel_x[lVar8] = dVar12;
        dVar12 = (*im->interpolation)((double)(iVar7 + (int)lVar8) - y);
        kernel_y[lVar8] = dVar12;
      }
      local_110 = 0.0;
      local_e8 = 0.0;
      local_108 = 0.0;
      local_f8 = 0.0;
      for (lVar8 = (long)iVar7; lVar8 < iVar9 + 3; lVar8 = lVar8 + 1) {
        dVar12 = kernel_y[lVar8 - iVar7];
        pdVar6 = kernel_x;
        lVar11 = (long)iVar5;
        if (im->trueColor == 0) {
          for (; lVar11 < iVar10 + 3; lVar11 = lVar11 + 1) {
            uVar1 = getPixelOverflowPalette(im,(int)lVar11,(int)lVar8,bgColor);
            dVar13 = *pdVar6 * dVar12;
            local_110 = local_110 + (double)(uVar1 >> 0x10 & 0xff) * dVar13;
            local_e8 = local_e8 + (double)(uVar1 >> 8 & 0xff) * dVar13;
            local_108 = local_108 + (double)(uVar1 & 0xff) * dVar13;
            local_f8 = local_f8 + (double)(uVar1 >> 0x18 & 0x7f) * dVar13;
            pdVar6 = pdVar6 + 1;
          }
        }
        else {
          for (; lVar11 < iVar10 + 3; lVar11 = lVar11 + 1) {
            uVar1 = getPixelOverflowTC(im,(int)lVar11,(int)lVar8,bgColor);
            dVar13 = *pdVar6 * dVar12;
            local_110 = local_110 + (double)(uVar1 >> 0x10 & 0xff) * dVar13;
            local_e8 = local_e8 + (double)(uVar1 >> 8 & 0xff) * dVar13;
            local_108 = local_108 + (double)(uVar1 & 0xff) * dVar13;
            local_f8 = local_f8 + (double)(uVar1 >> 0x18 & 0x7f) * dVar13;
            pdVar6 = pdVar6 + 1;
          }
        }
      }
      iVar9 = 0xff0000;
      if (local_110 <= 255.0) {
        dVar12 = 0.0;
        if (0.0 <= local_110) {
          dVar12 = local_110;
        }
        iVar9 = (int)dVar12 << 0x10;
      }
      iVar10 = 0xff00;
      if (local_e8 <= 255.0) {
        dVar12 = 0.0;
        if (0.0 <= local_e8) {
          dVar12 = local_e8;
        }
        iVar10 = (int)dVar12 << 8;
      }
      iVar5 = 0xff;
      if (local_108 <= 255.0) {
        dVar12 = 0.0;
        if (0.0 <= local_108) {
          dVar12 = local_108;
        }
        iVar5 = (int)dVar12;
      }
      iVar7 = 0x7f000000;
      if (local_f8 <= 127.0) {
        dVar12 = 0.0;
        if (0.0 <= local_f8) {
          dVar12 = local_f8;
        }
        iVar7 = (int)dVar12 << 0x18;
      }
      uVar1 = iVar10 + iVar9 + iVar5 + iVar7;
    }
  }
  return uVar1;
}

Assistant:

int getPixelInterpolated(gdImagePtr im, const double x, const double y, const int bgColor)
{
	const int xi=(int)(x);
	const int yi=(int)(y);
	int yii;
	int i;
	double kernel, kernel_cache_y;
	double kernel_x[12], kernel_y[4];
	double new_r = 0.0f, new_g = 0.0f, new_b = 0.0f, new_a = 0.0f;

	/* These methods use special implementations */
	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		return -1;
	}

	if (im->interpolation_id == GD_WEIGHTED4) {
		return getPixelInterpolateWeight(im, x, y, bgColor);
	}

	if (im->interpolation_id == GD_NEAREST_NEIGHBOUR) {
		if (im->trueColor == 1) {
			return getPixelOverflowTC(im, xi, yi, bgColor);
		} else {
			return getPixelOverflowPalette(im, xi, yi, bgColor);
		}
	}
	if (im->interpolation) {
		for (i=0; i<4; i++) {
			kernel_x[i] = (double) im->interpolation((double)(xi+i-1-x));
			kernel_y[i] = (double) im->interpolation((double)(yi+i-1-y));
		}
	} else {
		return -1;
	}

	/*
	 * TODO: use the known fast rgba multiplication implementation once
	 * the new formats are in place
	 */
	for (yii = yi-1; yii < yi+3; yii++) {
		int xii;
		kernel_cache_y = kernel_y[yii-(yi-1)];
		if (im->trueColor) {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowTC(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		} else {
			for (xii=xi-1; xii<xi+3; xii++) {
				const int rgbs = getPixelOverflowPalette(im, xii, yii, bgColor);

				kernel = kernel_cache_y * kernel_x[xii-(xi-1)];
				new_r += kernel * gdTrueColorGetRed(rgbs);
				new_g += kernel * gdTrueColorGetGreen(rgbs);
				new_b += kernel * gdTrueColorGetBlue(rgbs);
				new_a += kernel * gdTrueColorGetAlpha(rgbs);
			}
		}
	}

	new_r = CLAMP(new_r, 0, 255);
	new_g = CLAMP(new_g, 0, 255);
	new_b = CLAMP(new_b, 0, 255);
	new_a = CLAMP(new_a, 0, gdAlphaMax);

	return gdTrueColorAlpha(((int)new_r), ((int)new_g), ((int)new_b), ((int)new_a));
}